

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

void __thiscall
DListBase<Memory::ArenaAllocator,_RealCount>::RemoveElement<Memory::HeapAllocator>
          (DListBase<Memory::ArenaAllocator,_RealCount> *this,HeapAllocator *allocator,
          ArenaAllocator *element)

{
  undefined4 *puVar1;
  size_t sVar2;
  code *pcVar3;
  bool bVar4;
  DListNode<Memory::ArenaAllocator> *pDVar5;
  size_t *buffer;
  undefined8 *in_FS_OFFSET;
  
  buffer = &element[-1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
            freeListSize;
  pDVar5 = (DListNode<Memory::ArenaAllocator> *)this;
  do {
    pDVar5 = (pDVar5->super_DListNodeBase<Memory::ArenaAllocator>).next.node;
    if (pDVar5 == (DListNode<Memory::ArenaAllocator> *)this) break;
  } while (pDVar5 != (DListNode<Memory::ArenaAllocator> *)buffer);
  if (pDVar5 == (DListNode<Memory::ArenaAllocator> *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  sVar2 = *buffer;
  *(size_t *)
   element[-1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList =
       sVar2;
  *(void **)(sVar2 + 8) =
       element[-1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList
  ;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&element->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  Memory::HeapAllocator::Free(allocator,buffer,0x90);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }